

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

int __thiscall QTableView::sizeHintForColumn(QTableView *this,int column)

{
  QPersistentModelIndex *this_00;
  QTableViewPrivate *this_01;
  QWidgetData *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int logicalIndex;
  QAbstractItemModel *pQVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int visualIndex;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  int local_170;
  int local_16c;
  QModelIndex local_158;
  QModelIndex local_140;
  QModelIndex local_128;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar5 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar5 == (QAbstractItemModel *)0x0) {
    local_16c = -1;
  }
  else {
    QWidget::ensurePolished((QWidget *)this);
    iVar3 = QHeaderView::resizeContentsPrecision(this_01->horizontalHeader);
    iVar4 = QHeaderView::visualIndexAt(this_01->verticalHeader,0);
    visualIndex = 0;
    if (0 < iVar4) {
      visualIndex = iVar4;
    }
    pQVar1 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_170 = QHeaderView::visualIndexAt
                          (this_01->verticalHeader,
                           ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1);
    if ((local_170 == -1) ||
       ((((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data)
         ->widget_attributes & 0x8000) == 0)) {
      pQVar5 = (this_01->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_108,&(this_01->super_QAbstractItemViewPrivate).root);
      local_170 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,&local_108);
      local_170 = local_170 + -1;
    }
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&local_108);
    local_128.r = -1;
    local_128.c = -1;
    local_128.i = 0;
    local_128.m.ptr = (QAbstractItemModel *)0x0;
    local_16c = 0;
    iVar4 = 0;
    iVar8 = visualIndex;
    if (visualIndex <= local_170) {
      local_16c = 0;
      iVar6 = 0;
      iVar7 = visualIndex;
      do {
        iVar4 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar7);
        bVar2 = QHeaderView::isSectionHidden(this_01->verticalHeader,iVar4);
        if (!bVar2) {
          pQVar5 = (this_01->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_158,&(this_01->super_QAbstractItemViewPrivate).root);
          (**(code **)(*(long *)pQVar5 + 0x60))(&local_140,pQVar5,iVar4,column,&local_158);
          local_128.m.ptr = local_140.m.ptr;
          local_128.r = local_140.r;
          local_128.c = local_140.c;
          local_128.i = local_140.i;
          local_16c = QTableViewPrivate::widthHintForIndex(this_01,&local_128,local_16c,&local_108);
          iVar6 = iVar6 + 1;
          iVar4 = iVar3;
          iVar8 = iVar7;
          if (iVar6 == iVar3) break;
        }
        iVar7 = iVar7 + 1;
        iVar4 = iVar6;
        iVar8 = local_170 + 1;
      } while (local_170 + 1 != iVar7);
    }
    pQVar5 = (this_01->super_QAbstractItemViewPrivate).model;
    this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_140,this_00);
    iVar7 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,&local_140);
    if ((iVar4 != iVar3 && iVar3 != 0) && visualIndex < iVar7) {
      iVar7 = iVar7 + -1;
      iVar8 = iVar8 + -1;
      do {
        if ((visualIndex < 1) && (iVar7 <= iVar8)) break;
        if ((((byte)iVar4 & 0 < visualIndex) == 0) && (iVar8 != iVar7)) {
          iVar6 = iVar7;
          if (iVar7 < iVar8) {
            iVar6 = iVar8;
          }
          do {
            if (iVar6 == iVar8) goto LAB_0058ab1b;
            iVar8 = iVar8 + 1;
            logicalIndex = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
            bVar2 = QHeaderView::isSectionHidden(this_01->verticalHeader,logicalIndex);
          } while (bVar2);
        }
        else {
          do {
            iVar6 = iVar8;
            if (visualIndex < 1) goto LAB_0058ab1b;
            visualIndex = visualIndex + -1;
            logicalIndex = QHeaderView::logicalIndex(this_01->verticalHeader,visualIndex);
            bVar2 = QHeaderView::isSectionHidden(this_01->verticalHeader,logicalIndex);
          } while (bVar2);
        }
        iVar6 = iVar8;
        if (-1 < logicalIndex) {
          pQVar5 = (this_01->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_158,this_00);
          (**(code **)(*(long *)pQVar5 + 0x60))(&local_140,pQVar5,logicalIndex,column,&local_158);
          local_128.m.ptr = local_140.m.ptr;
          local_128.r = local_140.r;
          local_128.c = local_140.c;
          local_128.i = local_140.i;
          local_16c = QTableViewPrivate::widthHintForIndex(this_01,&local_128,local_16c,&local_108);
        }
LAB_0058ab1b:
        iVar8 = iVar6;
        iVar4 = iVar4 + 1;
      } while (iVar4 != iVar3);
    }
    bVar2 = this_01->showGrid;
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_16c = local_16c + (uint)bVar2;
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_16c;
}

Assistant:

int QTableView::sizeHintForColumn(int column) const
{
    Q_D(const QTableView);

    if (!model())
        return -1;

    ensurePolished();
    const int maximumProcessRows = d->horizontalHeader->resizeContentsPrecision();

    int top = qMax(0, d->verticalHeader->visualIndexAt(0));
    int bottom = d->verticalHeader->visualIndexAt(d->viewport->height());
    if (!isVisible() || bottom == -1) // the table don't have enough rows to fill the viewport
        bottom = d->model->rowCount(d->root) - 1;

    QStyleOptionViewItem option;
    initViewItemOption(&option);

    int hint = 0;
    int rowsProcessed = 0;
    QModelIndex index;
    int row = top;
    for (; row <= bottom; ++row) {
        int logicalRow = d->verticalHeader->logicalIndex(row);
        if (d->verticalHeader->isSectionHidden(logicalRow))
            continue;
        index = d->model->index(logicalRow, column, d->root);

        hint = d->widthHintForIndex(index, hint, option);
        ++rowsProcessed;
        if (rowsProcessed == maximumProcessRows)
            break;
    }

    const int actualBottom = d->model->rowCount(d->root) - 1;
    int idxTop = top;
    int idxBottom = row - 1;

    if (maximumProcessRows == 0 || actualBottom < idxTop)
        rowsProcessed = maximumProcessRows;  // skip the while loop

    while (rowsProcessed != maximumProcessRows && (idxTop > 0 || idxBottom < actualBottom)) {
        int logicalIdx  = -1;

        if ((rowsProcessed % 2 && idxTop > 0) || idxBottom == actualBottom) {
            while (idxTop > 0) {
                --idxTop;
                int logrow = d->verticalHeader->logicalIndex(idxTop);
                if (d->verticalHeader->isSectionHidden(logrow))
                    continue;
                logicalIdx = logrow;
                break;
            }
        } else {
            while (idxBottom < actualBottom) {
                ++idxBottom;
                int logrow = d->verticalHeader->logicalIndex(idxBottom);
                if (d->verticalHeader->isSectionHidden(logrow))
                    continue;
                logicalIdx = logrow;
                break;
            }
        }
        if (logicalIdx >= 0) {
            index = d->model->index(logicalIdx, column, d->root);
            hint = d->widthHintForIndex(index, hint, option);
        }
        ++rowsProcessed;
    }

    return d->showGrid ? hint + 1 : hint;
}